

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

void bribe_prog_malaphar(CHAR_DATA *mob,CHAR_DATA *ch,int amount)

{
  PC_DATA *pPVar1;
  int iVar2;
  AFFECT_DATA *pAVar3;
  
  pAVar3 = affect_find(mob->affected,(int)gsn_lesser_demon);
  if (pAVar3 != (AFFECT_DATA *)0x0) {
    if (amount < 10000) {
      do_say(mob,"Surely, friend, you do not believe me to be a pauper?");
      do_say(mob,"Entirely unacceptable, I\'m afraid.");
      act("$n wraps his cloak around him and vanishes into the shadows.",ch,(void *)0x0,(void *)0x0,
          0);
      ch->pcdata->lesserdata[2] = -1;
    }
    else {
      act("A thin smile crosses Malaphar\'s face as he tips his hat to you and vanishes.",ch,
          (void *)0x0,(void *)0x0,0);
      send_to_char("A wave of greed flashes over you as your fingers seem somehow more nimble.\n\r",
                   ch);
      pPVar1 = ch->pcdata;
      pPVar1->lesserdata[2] = 2;
      iVar2 = skill_lookup("steal");
      pPVar1->learned[iVar2] = 1;
    }
  }
  return;
}

Assistant:

void bribe_prog_malaphar(CHAR_DATA *mob, CHAR_DATA *ch, int amount)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_lesser_demon);

	if (!af)
		return;

	if (amount < 10000)
	{
		do_say(mob, "Surely, friend, you do not believe me to be a pauper?");
		do_say(mob, "Entirely unacceptable, I'm afraid.");

		act("$n wraps his cloak around him and vanishes into the shadows.", ch, 0, 0, TO_ROOM);
		ch->pcdata->lesserdata[LESSER_MALAPHAR] = FAVOR_FAILED;
		return;
	}

	act("A thin smile crosses Malaphar's face as he tips his hat to you and vanishes.", ch, 0, 0, TO_ROOM);
	send_to_char("A wave of greed flashes over you as your fingers seem somehow more nimble.\n\r", ch);

	ch->pcdata->lesserdata[LESSER_MALAPHAR] = FAVOR_GRANTED;
	ch->pcdata->learned[skill_lookup("steal")] = 1;
}